

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

GLenum polyscope::render::backend_openGL3_glfw::colorAttachNum(uint i)

{
  runtime_error *this;
  undefined4 in_EDI;
  GLenum local_4;
  
  switch(in_EDI) {
  case 0:
    local_4 = 0x8ce0;
    break;
  case 1:
    local_4 = 0x8ce1;
    break;
  case 2:
    local_4 = 0x8ce2;
    break;
  case 3:
    local_4 = 0x8ce3;
    break;
  case 4:
    local_4 = 0x8ce4;
    break;
  case 5:
    local_4 = 0x8ce5;
    break;
  case 6:
    local_4 = 0x8ce6;
    break;
  case 7:
    local_4 = 0x8ce7;
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"tried to use too many color attachments");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_4;
}

Assistant:

inline GLenum colorAttachNum(const unsigned int i) {
  // can we just add to the 0 one? couldn't find documentation saying yes for sure.
  switch (i) {
    case 0:     return GL_COLOR_ATTACHMENT0;
    case 1:     return GL_COLOR_ATTACHMENT1;
    case 2:     return GL_COLOR_ATTACHMENT2;
    case 3:     return GL_COLOR_ATTACHMENT3;
    case 4:     return GL_COLOR_ATTACHMENT4;
    case 5:     return GL_COLOR_ATTACHMENT5;
    case 6:     return GL_COLOR_ATTACHMENT6;
    case 7:     return GL_COLOR_ATTACHMENT7;
    default:          throw std::runtime_error("tried to use too many color attachments");
  }
  throw std::runtime_error("bad enum");
}